

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O0

void __thiscall
Memory::RecyclerSweep::
QueueEmptyHeapBlock<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket,
          SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *heapBlock)

{
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *next;
  code *pcVar1;
  bool bVar2;
  BucketData<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *pBVar3;
  undefined8 *in_FS_OFFSET;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *list;
  BucketData<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *bucketData;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *heapBlock_local;
  HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket_local;
  RecyclerSweep *this_local;
  
  if ((Js::Configuration::Global[0x2c158] & 1) != 0) {
    pBVar3 = GetBucketData<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
                       (this,heapBucket);
    if ((HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *)
        (heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).heapBucket != heapBucket)
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xa9,"(heapBlock->heapBucket == heapBucket)",
                         "heapBlock->heapBucket == heapBucket");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    SmallHeapBlockT<SmallAllocationBlockAttributes>::BackgroundReleasePagesSweep
              (&heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>,this->recycler);
    next = pBVar3->pendingEmptyBlockList;
    if (next == (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      if (pBVar3->pendingEmptyBlockListTail !=
          (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                           ,0xb0,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                           "bucketData.pendingEmptyBlockListTail == nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      pBVar3->pendingEmptyBlockListTail = heapBlock;
      this->hasPendingEmptyBlocks = true;
    }
    SmallLeafHeapBlockT<SmallAllocationBlockAttributes>::SetNextBlock(heapBlock,next);
    pBVar3->pendingEmptyBlockList = heapBlock;
  }
  return;
}

Assistant:

void
RecyclerSweep::QueueEmptyHeapBlock(HeapBucketT<TBlockType> const *heapBucket, TBlockType * heapBlock)
{
#if ENABLE_BACKGROUND_PAGE_FREEING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        auto& bucketData = this->GetBucketData(heapBucket);
        Assert(heapBlock->heapBucket == heapBucket);

        heapBlock->BackgroundReleasePagesSweep(recycler);

        TBlockType * list = bucketData.pendingEmptyBlockList;
        if (list == nullptr)
        {
            Assert(bucketData.pendingEmptyBlockListTail == nullptr);
            bucketData.pendingEmptyBlockListTail = heapBlock;
            this->hasPendingEmptyBlocks = true;
        }
        heapBlock->SetNextBlock(list);
        bucketData.pendingEmptyBlockList = heapBlock;
    }
#endif
}